

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::DEC_ZP(CPU *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  
  this->cycles = 5;
  uVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 2;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(uVar2 & 0xff));
  this->cycles = this->cycles - 1;
  bVar1 = (char)iVar3 - 1;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)(uVar2 & 0xff),(ulong)bVar1);
  this->cycles = this->cycles - 1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::DEC_ZP()
{
    cycles = 5;
    uint8_t addr = GetByte(), result = ReadByte(addr) - 1;
    cycles--;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}